

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int mbedtls_ssl_validate_ciphersuite
              (mbedtls_ssl_context *ssl,mbedtls_ssl_ciphersuite_t *suite_info,
              mbedtls_ssl_protocol_version min_tls_version,
              mbedtls_ssl_protocol_version max_tls_version)

{
  int iVar1;
  mbedtls_ssl_protocol_version max_tls_version_local;
  mbedtls_ssl_protocol_version min_tls_version_local;
  mbedtls_ssl_ciphersuite_t *suite_info_local;
  mbedtls_ssl_context *ssl_local;
  
  if (suite_info == (mbedtls_ssl_ciphersuite_t *)0x0) {
    ssl_local._4_4_ = -1;
  }
  else if ((max_tls_version < suite_info->min_tls_version) ||
          (suite_info->max_tls_version < min_tls_version)) {
    ssl_local._4_4_ = -1;
  }
  else {
    if ((suite_info->key_exchange == '\v') &&
       (iVar1 = mbedtls_ecjpake_check(&ssl->handshake->ecjpake_ctx), iVar1 != 0)) {
      return -1;
    }
    iVar1 = mbedtls_ssl_ciphersuite_uses_psk(suite_info);
    if ((iVar1 != 0) && (iVar1 = mbedtls_ssl_conf_has_static_psk(ssl->conf), iVar1 == 0)) {
      return -1;
    }
    ssl_local._4_4_ = 0;
  }
  return ssl_local._4_4_;
}

Assistant:

int mbedtls_ssl_validate_ciphersuite(
    const mbedtls_ssl_context *ssl,
    const mbedtls_ssl_ciphersuite_t *suite_info,
    mbedtls_ssl_protocol_version min_tls_version,
    mbedtls_ssl_protocol_version max_tls_version)
{
    (void) ssl;

    if (suite_info == NULL) {
        return -1;
    }

    if ((suite_info->min_tls_version > max_tls_version) ||
        (suite_info->max_tls_version < min_tls_version)) {
        return -1;
    }

#if defined(MBEDTLS_SSL_PROTO_TLS1_2) && defined(MBEDTLS_SSL_CLI_C)
#if defined(MBEDTLS_KEY_EXCHANGE_ECJPAKE_ENABLED)
#if defined(MBEDTLS_USE_PSA_CRYPTO)
    if (suite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECJPAKE &&
        ssl->handshake->psa_pake_ctx_is_ok != 1)
#else
    if (suite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECJPAKE &&
        mbedtls_ecjpake_check(&ssl->handshake->ecjpake_ctx) != 0)
#endif /* MBEDTLS_USE_PSA_CRYPTO */
    {
        return -1;
    }
#endif

    /* Don't suggest PSK-based ciphersuite if no PSK is available. */
#if defined(MBEDTLS_KEY_EXCHANGE_SOME_PSK_ENABLED)
    if (mbedtls_ssl_ciphersuite_uses_psk(suite_info) &&
        mbedtls_ssl_conf_has_static_psk(ssl->conf) == 0) {
        return -1;
    }
#endif /* MBEDTLS_KEY_EXCHANGE_SOME_PSK_ENABLED */
#endif /* MBEDTLS_SSL_PROTO_TLS1_2 */

    return 0;
}